

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_step(lua_State *L)

{
  global_State *g_00;
  lu_mem lVar1;
  bool bVar2;
  lu_mem work;
  l_mem debt;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  work = getdebt(g_00);
  if (g_00->gcrunning == '\0') {
    luaE_setdebt(g_00,-24000);
  }
  else {
    do {
      lVar1 = singlestep(L);
      work = work - lVar1;
      bVar2 = false;
      if (-0x960 < (long)work) {
        bVar2 = g_00->gcstate != '\a';
      }
    } while (bVar2);
    if (g_00->gcstate == '\a') {
      setpause(g_00);
    }
    else {
      luaE_setdebt(g_00,((long)work / (long)g_00->gcstepmul) * 200);
      runafewfinalizers(L);
    }
  }
  return;
}

Assistant:

void luaC_step(lua_State *L) {
    global_State *g = G(L);
    l_mem debt = getdebt(g);  /* GC deficit (be paid now) */
    if (!g->gcrunning) {  /* not running? */
        luaE_setdebt(g, -GCSTEPSIZE * 10);  /* avoid being called too often */
        return;
    }
    do {  /* repeat until pause or enough "credit" (negative debt) */
        lu_mem work = singlestep(L);  /* perform one single step */
        debt -= work;
    } while (debt > -GCSTEPSIZE && g->gcstate != GCSpause);
    if (g->gcstate == GCSpause)
        setpause(g);  /* pause until next cycle */
    else {
        debt = (debt / g->gcstepmul) * STEPMULADJ;  /* convert 'work units' to Kb */
        luaE_setdebt(g, debt);
        runafewfinalizers(L);
    }
}